

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall
fasttext::FastText::setMatrices
          (FastText *this,shared_ptr<fasttext::DenseMatrix> *inputMatrix,
          shared_ptr<fasttext::DenseMatrix> *outputMatrix)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  DenseMatrix *pDVar3;
  Matrix *__tmp;
  int64_t iVar4;
  int64_t iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  
  iVar4 = Matrix::size((this->input_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
  iVar5 = Matrix::size((this->output_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
  if (iVar4 == iVar5) {
    peVar1 = (inputMatrix->super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (p_Var6 = (inputMatrix->super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi, p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
       ) {
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
    (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &peVar1->super_Matrix;
    p_Var2 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var6;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    peVar1 = (outputMatrix->super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (p_Var6 = (outputMatrix->
                 super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi, p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
    (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &peVar1->super_Matrix;
    p_Var2 = (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var6;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    pDVar3 = (this->wordVectors_)._M_t.
             super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
             .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl;
    (this->wordVectors_)._M_t.
    super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>._M_t.
    super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>.
    super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl = (DenseMatrix *)0x0;
    if (pDVar3 != (DenseMatrix *)0x0) {
      (**(code **)((long)(pDVar3->super_Matrix)._vptr_Matrix + 8))();
    }
    iVar4 = Matrix::size((this->input_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
    ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->dim =
         (int)iVar4;
    buildModel(this);
    return;
  }
  __assert_fail("input_->size(1) == output_->size(1)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/fasttext.cc"
                ,0x4c,
                "void fasttext::FastText::setMatrices(const std::shared_ptr<DenseMatrix> &, const std::shared_ptr<DenseMatrix> &)"
               );
}

Assistant:

void FastText::setMatrices(
    const std::shared_ptr<DenseMatrix>& inputMatrix,
    const std::shared_ptr<DenseMatrix>& outputMatrix) {
  assert(input_->size(1) == output_->size(1));

  input_ = std::dynamic_pointer_cast<Matrix>(inputMatrix);
  output_ = std::dynamic_pointer_cast<Matrix>(outputMatrix);
  wordVectors_.reset();
  args_->dim = input_->size(1);

  buildModel();
}